

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_handle.c
# Opt level: O3

uint32_t skynet_handle_findname(char *name)

{
  int *piVar1;
  handle_name *phVar2;
  handle_storage *phVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  phVar3 = H;
  while( true ) {
    do {
    } while ((phVar3->lock).write != 0);
    LOCK();
    piVar1 = &(phVar3->lock).read;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    if ((phVar3->lock).write == 0) break;
    LOCK();
    piVar1 = &(phVar3->lock).read;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
  }
  if (0 < phVar3->name_count) {
    iVar8 = phVar3->name_count + -1;
    phVar2 = phVar3->name;
    iVar7 = 0;
    do {
      uVar6 = (uint)(iVar8 + iVar7) >> 1;
      iVar4 = strcmp(phVar2[uVar6].name,name);
      if (iVar4 == 0) {
        uVar5 = phVar2[uVar6].handle;
        goto LAB_00113580;
      }
      if (iVar4 < 0) {
        iVar7 = uVar6 + 1;
      }
      else {
        iVar8 = uVar6 - 1;
      }
    } while (iVar7 <= iVar8);
  }
  uVar5 = 0;
LAB_00113580:
  LOCK();
  piVar1 = &(phVar3->lock).read;
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  return uVar5;
}

Assistant:

uint32_t 
skynet_handle_findname(const char * name) {
	struct handle_storage *s = H;

	rwlock_rlock(&s->lock);

	uint32_t handle = 0;

	int begin = 0;
	int end = s->name_count - 1;
	while (begin<=end) {
		int mid = (begin+end)/2;
		struct handle_name *n = &s->name[mid];
		int c = strcmp(n->name, name);
		if (c==0) {
			handle = n->handle;
			break;
		}
		if (c<0) {
			begin = mid + 1;
		} else {
			end = mid - 1;
		}
	}

	rwlock_runlock(&s->lock);

	return handle;
}